

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cc
# Opt level: O2

int main(void)

{
  Template *this;
  string nothing_will_come_of_nothing;
  PerExpandData data;
  TemplateDictionary dict;
  undefined1 local_e8 [32];
  PerExpandData local_c8;
  TemplateString local_a8;
  TemplateString local_88 [3];
  
  ctemplate::TemplateString::TemplateString(local_88,"key");
  ctemplate::TemplateString::TemplateString((TemplateString *)local_e8,"example");
  ctemplate::Template::StringToTemplateCache(local_88,(TemplateString *)local_e8);
  ctemplate::TemplateString::TemplateString(local_88,"key");
  this = (Template *)ctemplate::Template::GetTemplate(local_88,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString((TemplateString *)local_e8,"my dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)local_88,(TemplateString *)local_e8,(UnsafeArena *)0x0);
  local_e8._0_8_ = local_e8 + 0x10;
  local_e8._8_8_ = 0;
  local_e8[0x10] = false;
  ctemplate::Template::Expand(this,(string *)local_e8,(TemplateDictionaryInterface *)local_88);
  local_e8._8_8_ = 0;
  local_c8.expand_modifier_ = (TemplateModifier *)0x0;
  local_c8.map_ = (DataMap *)0x0;
  local_c8.annotate_path_ = (char *)0x0;
  local_c8.annotator_ = (TemplateAnnotator *)0x0;
  *(char *)local_e8._0_8_ = '\0';
  ctemplate::TemplateString::TemplateString(&local_a8,"key");
  ctemplate::ExpandWithData
            (&local_a8,DO_NOT_STRIP,(TemplateDictionaryInterface *)local_88,&local_c8,
             (string *)local_e8);
  puts("PASS.");
  ctemplate::PerExpandData::~PerExpandData(&local_c8);
  std::__cxx11::string::~string((string *)local_e8);
  ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)local_88);
  return 0;
}

Assistant:

int main() {
  template_ns::Template::StringToTemplateCache("key", "example");
  template_ns::Template* tpl = template_ns::Template::GetTemplate(
      "key", template_ns::DO_NOT_STRIP);
  template_ns::TemplateDictionary dict("my dict");
  std::string nothing_will_come_of_nothing;
  tpl->Expand(&nothing_will_come_of_nothing, &dict);

  // Try using a bit more functionality.
  template_ns::PerExpandData data;
  nothing_will_come_of_nothing.clear();
  template_ns::ExpandWithData("key", template_ns::DO_NOT_STRIP, &dict, &data,
                              &nothing_will_come_of_nothing);

  printf("PASS.\n");
  return 0;
}